

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtppacket.cpp
# Opt level: O2

void __thiscall
jrtplib::RTPPacket::RTPPacket
          (RTPPacket *this,uint8_t payloadtype,void *payloaddata,size_t payloadlen,uint16_t seqnr,
          uint32_t timestamp,uint32_t ssrc,bool gotmarker,uint8_t numcsrcs,uint32_t *csrcs,
          bool gotextension,uint16_t extensionid,uint16_t extensionlen_numwords,void *extensiondata,
          void *buffer,size_t buffersize,RTPMemoryManager *mgr)

{
  int iVar1;
  
  (this->super_RTPMemoryObject).mgr = mgr;
  (this->super_RTPMemoryObject)._vptr_RTPMemoryObject = (_func_int **)&PTR__RTPPacket_0014ed08;
  (this->receivetime).m_t = 0.0;
  Clear(this);
  if (buffer == (void *)0x0) {
    iVar1 = -0x17;
  }
  else if (buffersize == 0) {
    iVar1 = -0x18;
  }
  else {
    iVar1 = BuildPacket(this,payloadtype,payloaddata,payloadlen,seqnr,timestamp,ssrc,gotmarker,
                        numcsrcs,csrcs,gotextension,extensionid,extensionlen_numwords,extensiondata,
                        buffer,buffersize);
  }
  this->error = iVar1;
  return;
}

Assistant:

RTPPacket::RTPPacket(uint8_t payloadtype,const void *payloaddata,size_t payloadlen,uint16_t seqnr,
		  uint32_t timestamp,uint32_t ssrc,bool gotmarker,uint8_t numcsrcs,const uint32_t *csrcs,
		  bool gotextension,uint16_t extensionid,uint16_t extensionlen_numwords,const void *extensiondata,
		  void *buffer,size_t buffersize, RTPMemoryManager *mgr) : RTPMemoryObject(mgr),receivetime(0,0)
{
	Clear();
	if (buffer == 0)
		error = ERR_RTP_PACKET_EXTERNALBUFFERNULL;
	else if (buffersize <= 0)
		error = ERR_RTP_PACKET_ILLEGALBUFFERSIZE;
	else
		error = BuildPacket(payloadtype,payloaddata,payloadlen,seqnr,timestamp,ssrc,gotmarker,numcsrcs,
		                    csrcs,gotextension,extensionid,extensionlen_numwords,extensiondata,buffer,buffersize);
}